

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InetAddress.cpp
# Opt level: O3

void __thiscall higan::InetAddress::InetAddress(InetAddress *this,int port)

{
  long *local_48;
  long local_40;
  long local_38 [2];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"0.0.0.0","");
  (this->ip_)._M_dataplus._M_p = (pointer)&(this->ip_).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)this,local_48,local_40 + (long)local_48);
  this->port_ = port;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

InetAddress::InetAddress(int port):
		InetAddress("0.0.0.0", port)
{

}